

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileStorageCommitState::SingleFileStorageCommitState
          (SingleFileStorageCommitState *this,StorageManager *storage,WriteAheadLog *wal)

{
  __int_type _Var1;
  pointer pWVar2;
  idx_t iVar3;
  
  (this->super_StorageCommitState)._vptr_StorageCommitState =
       (_func_int **)&PTR__SingleFileStorageCommitState_0246b8c0;
  this->initial_wal_size = 0;
  this->initial_written = 0;
  this->wal = wal;
  this->state = IN_PROGRESS;
  (this->optimistically_written_data)._M_h._M_buckets =
       &(this->optimistically_written_data)._M_h._M_single_bucket;
  (this->optimistically_written_data)._M_h._M_bucket_count = 1;
  (this->optimistically_written_data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->optimistically_written_data)._M_h._M_element_count = 0;
  (this->optimistically_written_data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->optimistically_written_data)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->optimistically_written_data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pWVar2 = unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true>::
           operator->(&storage->wal);
  _Var1 = (pWVar2->wal_size).super___atomic_base<unsigned_long>._M_i;
  iVar3 = WriteAheadLog::GetTotalWritten(wal);
  this->initial_written = iVar3;
  this->initial_wal_size = _Var1;
  return;
}

Assistant:

SingleFileStorageCommitState::SingleFileStorageCommitState(StorageManager &storage, WriteAheadLog &wal)
    : wal(wal), state(WALCommitState::IN_PROGRESS) {
	auto initial_size = storage.GetWALSize();
	initial_written = wal.GetTotalWritten();
	initial_wal_size = initial_size;
}